

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O3

void Imath_3_2::jacobiEigenSolver<float>
               (Matrix44<float> *A,Vec4<float> *S,Matrix44<float> *V,float tol)

{
  long lVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int i;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  float *pfVar9;
  int i_1;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float local_18 [4];
  
  V->x[0][0] = 1.0;
  *(float *)((long)(V->x + 0) + 4) = 0.0;
  *(float *)((long)(V->x + 0) + 8) = 0.0;
  *(undefined8 *)(V->x[0] + 3) = 0;
  V->x[1][1] = 1.0;
  *(float *)((long)(V->x + 1) + 8) = 0.0;
  *(float *)((long)(V->x + 1) + 0xc) = 0.0;
  *(float *)((long)(V->x + 2) + 0) = 0.0;
  *(float *)((long)(V->x + 2) + 4) = 0.0;
  V->x[2][2] = 1.0;
  *(undefined8 *)(V->x[2] + 3) = 0;
  *(float *)((long)(V->x + 3) + 4) = 0.0;
  *(float *)((long)(V->x + 3) + 8) = 0.0;
  V->x[3][3] = 1.0;
  lVar7 = 0;
  pfVar9 = (float *)A;
  do {
    (&S->x)[lVar7] = *pfVar9;
    lVar7 = lVar7 + 1;
    pfVar9 = pfVar9 + 5;
  } while (lVar7 != 4);
  fVar11 = 0.0;
  uVar8 = 0;
  pfVar9 = (float *)A;
  do {
    if (uVar8 < 3) {
      lVar7 = 1;
      fVar17 = fVar11;
      do {
        fVar11 = ABS(pfVar9[lVar7]);
        if (ABS(pfVar9[lVar7]) <= fVar17) {
          fVar11 = fVar17;
        }
        lVar1 = uVar8 + lVar7;
        lVar7 = lVar7 + 1;
        fVar17 = fVar11;
      } while (lVar1 != 3);
    }
    uVar8 = uVar8 + 1;
    pfVar9 = pfVar9 + 5;
  } while (uVar8 != 4);
  fVar11 = fVar11 * tol;
  if ((fVar11 != 0.0) || (NAN(fVar11))) {
    uVar6 = 0;
    do {
      local_18[0] = 0.0;
      local_18[1] = 0.0;
      local_18[2] = 0.0;
      local_18[3] = 0.0;
      fVar19 = A->x[0][0];
      fVar17 = A->x[0][1];
      fVar12 = A->x[1][1];
      fVar15 = fVar12 - fVar19;
      if (ABS(fVar17 + fVar17) <= ABS(fVar15) * tol) {
        A->x[0][1] = 0.0;
      }
      else {
        fVar15 = fVar15 / (fVar17 + fVar17);
        fVar13 = *(float *)(&DAT_0014a120 + (ulong)(fVar15 < 0.0) * 4) /
                 (SQRT(fVar15 * fVar15 + 1.0) + ABS(fVar15));
        fVar15 = 1.0 / SQRT(fVar13 * fVar13 + 1.0);
        fVar17 = fVar17 * fVar13;
        fVar13 = fVar13 * fVar15;
        fVar16 = fVar13 / (fVar15 + 1.0);
        local_18[0] = 0.0 - fVar17;
        local_18[1] = fVar17 + 0.0;
        A->x[0][0] = fVar19 - fVar17;
        A->x[1][1] = fVar12 + fVar17;
        A->x[0][1] = 0.0;
        uVar4 = *(undefined8 *)(A->x[0] + 2);
        uVar5 = *(undefined8 *)(A->x[1] + 2);
        fVar17 = (float)uVar4;
        fVar12 = (float)((ulong)uVar4 >> 0x20);
        fVar19 = (float)uVar5;
        fVar15 = (float)((ulong)uVar5 >> 0x20);
        *(ulong *)(A->x[0] + 2) =
             CONCAT44(fVar12 - (fVar16 * fVar12 + fVar15) * fVar13,
                      fVar17 - (fVar16 * fVar17 + fVar19) * fVar13);
        *(ulong *)(A->x[1] + 2) =
             CONCAT44((fVar12 - fVar16 * fVar15) * fVar13 + fVar15,
                      (fVar17 - fVar16 * fVar19) * fVar13 + fVar19);
        fVar17 = V->x[1][0];
        fVar2 = V->x[0][0];
        fVar3 = V->x[0][1];
        fVar12 = V->x[2][0];
        fVar19 = V->x[3][0];
        fVar15 = V->x[1][1];
        fVar14 = V->x[2][1];
        fVar20 = V->x[3][1];
        V->x[0][0] = fVar2 - (fVar16 * fVar2 + fVar3) * fVar13;
        V->x[0][1] = (fVar2 - fVar16 * fVar3) * fVar13 + fVar3;
        *(ulong *)V->x[1] =
             CONCAT44((fVar17 - fVar16 * fVar15) * fVar13 + fVar15,
                      fVar17 - (fVar16 * fVar17 + fVar15) * fVar13);
        *(ulong *)V->x[2] =
             CONCAT44((fVar12 - fVar16 * fVar14) * fVar13 + fVar14,
                      fVar12 - (fVar16 * fVar12 + fVar14) * fVar13);
        *(ulong *)V->x[3] =
             CONCAT44((fVar19 - fVar16 * fVar20) * fVar13 + fVar20,
                      fVar19 - (fVar16 * fVar19 + fVar20) * fVar13);
        fVar19 = A->x[0][0];
      }
      fVar15 = local_18[1];
      fVar17 = A->x[0][2];
      fVar12 = A->x[2][2];
      fVar14 = fVar12 - fVar19;
      if (ABS(fVar17 + fVar17) <= ABS(fVar14) * tol) {
        A->x[0][2] = 0.0;
      }
      else {
        fVar14 = fVar14 / (fVar17 + fVar17);
        fVar16 = *(float *)(&DAT_0014a120 + (ulong)(fVar14 < 0.0) * 4) /
                 (SQRT(fVar14 * fVar14 + 1.0) + ABS(fVar14));
        fVar14 = 1.0 / SQRT(fVar16 * fVar16 + 1.0);
        fVar17 = fVar17 * fVar16;
        fVar16 = fVar16 * fVar14;
        fVar18 = fVar16 / (fVar14 + 1.0);
        local_18[0] = local_18[0] - fVar17;
        local_18[2] = fVar17 + 0.0;
        local_18[3] = 0.0;
        A->x[0][0] = fVar19 - fVar17;
        A->x[2][2] = fVar12 + fVar17;
        A->x[0][2] = 0.0;
        fVar17 = A->x[1][2];
        fVar12 = A->x[0][1];
        fVar19 = A->x[0][3];
        A->x[0][1] = fVar12 - (fVar18 * fVar12 + fVar17) * fVar16;
        A->x[1][2] = (fVar12 - fVar18 * fVar17) * fVar16 + fVar17;
        fVar17 = A->x[2][3];
        A->x[0][3] = fVar19 - (fVar18 * fVar19 + fVar17) * fVar16;
        A->x[2][3] = (fVar19 - fVar18 * fVar17) * fVar16 + fVar17;
        fVar17 = V->x[1][0];
        fVar3 = V->x[0][0];
        fVar13 = V->x[0][2];
        fVar12 = V->x[2][0];
        fVar19 = V->x[3][0];
        fVar14 = V->x[1][2];
        fVar20 = V->x[2][2];
        fVar2 = V->x[3][2];
        V->x[0][0] = fVar3 - (fVar18 * fVar3 + fVar13) * fVar16;
        V->x[1][0] = fVar17 - (fVar18 * fVar17 + fVar14) * fVar16;
        V->x[2][0] = fVar12 - (fVar18 * fVar12 + fVar20) * fVar16;
        V->x[3][0] = fVar19 - (fVar18 * fVar19 + fVar2) * fVar16;
        V->x[0][2] = (fVar3 - fVar18 * fVar13) * fVar16 + fVar13;
        V->x[1][2] = (fVar17 - fVar18 * fVar14) * fVar16 + fVar14;
        V->x[2][2] = (fVar12 - fVar18 * fVar20) * fVar16 + fVar20;
        V->x[3][2] = (fVar19 - fVar18 * fVar2) * fVar16 + fVar2;
        fVar19 = A->x[0][0];
      }
      fVar14 = local_18[2];
      local_18[3] = 0.0;
      fVar17 = A->x[0][3];
      fVar12 = A->x[3][3];
      fVar20 = fVar12 - fVar19;
      if (ABS(fVar17 + fVar17) <= ABS(fVar20) * tol) {
        A->x[0][3] = 0.0;
      }
      else {
        fVar20 = fVar20 / (fVar17 + fVar17);
        fVar18 = *(float *)(&DAT_0014a120 + (ulong)(fVar20 < 0.0) * 4) /
                 (SQRT(fVar20 * fVar20 + 1.0) + ABS(fVar20));
        fVar20 = 1.0 / SQRT(fVar18 * fVar18 + 1.0);
        fVar17 = fVar17 * fVar18;
        fVar18 = fVar18 * fVar20;
        fVar21 = fVar18 / (fVar20 + 1.0);
        local_18[0] = local_18[0] - fVar17;
        local_18[3] = fVar17 + 0.0;
        A->x[0][0] = fVar19 - fVar17;
        A->x[3][3] = fVar12 + fVar17;
        A->x[0][3] = 0.0;
        fVar17 = A->x[1][3];
        fVar12 = A->x[2][3];
        uVar4 = *(undefined8 *)(A->x[0] + 1);
        fVar19 = (float)uVar4;
        A->x[1][3] = (fVar19 - fVar21 * fVar17) * fVar18 + fVar17;
        fVar20 = (float)((ulong)uVar4 >> 0x20);
        *(ulong *)(A->x[0] + 1) =
             CONCAT44(fVar20 - (fVar21 * fVar20 + fVar12) * fVar18,
                      fVar19 - (fVar21 * fVar19 + fVar17) * fVar18);
        A->x[2][3] = (fVar20 - fVar21 * fVar12) * fVar18 + fVar12;
        fVar17 = V->x[1][0];
        fVar13 = V->x[0][0];
        fVar16 = V->x[0][3];
        fVar12 = V->x[2][0];
        fVar19 = V->x[3][0];
        fVar20 = V->x[1][3];
        fVar2 = V->x[2][3];
        fVar3 = V->x[3][3];
        V->x[0][0] = fVar13 - (fVar21 * fVar13 + fVar16) * fVar18;
        V->x[1][0] = fVar17 - (fVar21 * fVar17 + fVar20) * fVar18;
        V->x[0][3] = (fVar13 - fVar21 * fVar16) * fVar18 + fVar16;
        *(ulong *)(V->x[1] + 3) =
             CONCAT44(fVar12 - (fVar21 * fVar12 + fVar2) * fVar18,
                      (fVar17 - fVar21 * fVar20) * fVar18 + fVar20);
        *(ulong *)(V->x[2] + 3) =
             CONCAT44(fVar19 - (fVar21 * fVar19 + fVar3) * fVar18,
                      (fVar12 - fVar21 * fVar2) * fVar18 + fVar2);
        V->x[3][3] = (fVar19 - fVar21 * fVar3) * fVar18 + fVar3;
      }
      fVar19 = A->x[1][1];
      fVar17 = A->x[1][2];
      fVar12 = A->x[2][2];
      fVar20 = fVar12 - fVar19;
      if (ABS(fVar17 + fVar17) <= ABS(fVar20) * tol) {
        A->x[1][2] = 0.0;
      }
      else {
        fVar20 = fVar20 / (fVar17 + fVar17);
        fVar18 = *(float *)(&DAT_0014a120 + (ulong)(fVar20 < 0.0) * 4) /
                 (SQRT(fVar20 * fVar20 + 1.0) + ABS(fVar20));
        fVar20 = 1.0 / SQRT(fVar18 * fVar18 + 1.0);
        fVar17 = fVar17 * fVar18;
        fVar18 = fVar18 * fVar20;
        fVar21 = fVar18 / (fVar20 + 1.0);
        fVar15 = fVar15 - fVar17;
        local_18[1] = fVar15;
        fVar14 = fVar14 + fVar17;
        local_18[2] = fVar14;
        A->x[1][1] = fVar19 - fVar17;
        A->x[2][2] = fVar12 + fVar17;
        A->x[1][2] = 0.0;
        uVar4 = *(undefined8 *)(A->x[0] + 1);
        fVar17 = (float)uVar4;
        fVar12 = (float)((ulong)uVar4 >> 0x20);
        *(ulong *)(A->x[0] + 1) =
             CONCAT44(fVar18 * (-fVar21 * fVar12 + fVar17) + fVar12,
                      -fVar18 * (fVar21 * fVar17 + fVar12) + fVar17);
        fVar17 = A->x[1][3];
        fVar12 = A->x[2][3];
        A->x[1][3] = fVar17 - (fVar21 * fVar17 + fVar12) * fVar18;
        A->x[2][3] = (fVar17 - fVar21 * fVar12) * fVar18 + fVar12;
        fVar17 = V->x[1][1];
        fVar13 = V->x[0][1];
        fVar16 = V->x[0][2];
        fVar12 = V->x[2][1];
        fVar19 = V->x[3][1];
        fVar20 = V->x[1][2];
        fVar2 = V->x[2][2];
        fVar3 = V->x[3][2];
        V->x[0][1] = fVar13 - (fVar21 * fVar13 + fVar16) * fVar18;
        V->x[0][2] = (fVar13 - fVar21 * fVar16) * fVar18 + fVar16;
        *(ulong *)(V->x[1] + 1) =
             CONCAT44((fVar17 - fVar21 * fVar20) * fVar18 + fVar20,
                      fVar17 - (fVar21 * fVar17 + fVar20) * fVar18);
        *(ulong *)(V->x[2] + 1) =
             CONCAT44((fVar12 - fVar21 * fVar2) * fVar18 + fVar2,
                      fVar12 - (fVar21 * fVar12 + fVar2) * fVar18);
        *(ulong *)(V->x[3] + 1) =
             CONCAT44((fVar19 - fVar21 * fVar3) * fVar18 + fVar3,
                      fVar19 - (fVar21 * fVar19 + fVar3) * fVar18);
        fVar19 = A->x[1][1];
      }
      fVar17 = A->x[1][3];
      fVar12 = A->x[3][3];
      if (ABS(fVar17 + fVar17) <= ABS(fVar12 - fVar19) * tol) {
        A->x[1][3] = 0.0;
      }
      else {
        fVar20 = (fVar12 - fVar19) / (fVar17 + fVar17);
        fVar16 = *(float *)(&DAT_0014a120 + (ulong)(fVar20 < 0.0) * 4) /
                 (SQRT(fVar20 * fVar20 + 1.0) + ABS(fVar20));
        fVar20 = 1.0 / SQRT(fVar16 * fVar16 + 1.0);
        fVar17 = fVar17 * fVar16;
        fVar16 = fVar16 * fVar20;
        fVar18 = fVar16 / (fVar20 + 1.0);
        local_18[1] = fVar15 - fVar17;
        local_18[3] = local_18[3] + fVar17;
        A->x[1][1] = fVar19 - fVar17;
        A->x[3][3] = fVar12 + fVar17;
        A->x[1][3] = 0.0;
        fVar17 = A->x[0][1];
        fVar12 = A->x[0][3];
        A->x[0][1] = fVar17 - (fVar18 * fVar17 + fVar12) * fVar16;
        A->x[0][3] = (fVar17 - fVar18 * fVar12) * fVar16 + fVar12;
        fVar17 = A->x[1][2];
        fVar12 = A->x[2][3];
        A->x[1][2] = fVar17 - (fVar18 * fVar17 + fVar12) * fVar16;
        A->x[2][3] = (fVar17 - fVar18 * fVar12) * fVar16 + fVar12;
        fVar17 = V->x[1][1];
        fVar3 = V->x[0][1];
        fVar13 = V->x[0][3];
        fVar12 = V->x[2][1];
        fVar19 = V->x[3][1];
        fVar15 = V->x[1][3];
        fVar20 = V->x[2][3];
        fVar2 = V->x[3][3];
        V->x[0][1] = fVar3 - (fVar18 * fVar3 + fVar13) * fVar16;
        V->x[1][1] = fVar17 - (fVar18 * fVar17 + fVar15) * fVar16;
        V->x[2][1] = fVar12 - (fVar18 * fVar12 + fVar20) * fVar16;
        V->x[3][1] = fVar19 - (fVar18 * fVar19 + fVar2) * fVar16;
        V->x[0][3] = (fVar3 - fVar18 * fVar13) * fVar16 + fVar13;
        V->x[1][3] = (fVar17 - fVar18 * fVar15) * fVar16 + fVar15;
        V->x[2][3] = (fVar12 - fVar18 * fVar20) * fVar16 + fVar20;
        V->x[3][3] = (fVar19 - fVar18 * fVar2) * fVar16 + fVar2;
        fVar12 = A->x[3][3];
      }
      fVar17 = A->x[2][2];
      fVar19 = A->x[2][3];
      fVar15 = fVar12 - fVar17;
      if (ABS(fVar19 + fVar19) <= ABS(fVar15) * tol) {
        A->x[2][3] = 0.0;
      }
      else {
        fVar15 = fVar15 / (fVar19 + fVar19);
        fVar13 = *(float *)(&DAT_0014a120 + (ulong)(fVar15 < 0.0) * 4) /
                 (SQRT(fVar15 * fVar15 + 1.0) + ABS(fVar15));
        fVar15 = 1.0 / SQRT(fVar13 * fVar13 + 1.0);
        fVar19 = fVar19 * fVar13;
        fVar13 = fVar13 * fVar15;
        fVar16 = fVar13 / (fVar15 + 1.0);
        local_18[3] = local_18[3] + fVar19;
        local_18[2] = fVar14 - fVar19;
        A->x[2][2] = fVar17 - fVar19;
        A->x[3][3] = fVar12 + fVar19;
        A->x[2][3] = 0.0;
        uVar4 = *(undefined8 *)(A->x[0] + 2);
        uVar5 = *(undefined8 *)(A->x[1] + 2);
        fVar17 = (float)uVar4;
        fVar12 = (float)((ulong)uVar4 >> 0x20);
        *(ulong *)(A->x[0] + 2) =
             CONCAT44((-fVar16 * fVar12 + fVar17) * fVar13 + fVar12,
                      (fVar16 * fVar17 + fVar12) * -fVar13 + fVar17);
        fVar17 = (float)uVar5;
        fVar12 = (float)((ulong)uVar5 >> 0x20);
        *(ulong *)(A->x[1] + 2) =
             CONCAT44((-fVar16 * fVar12 + fVar17) * fVar13 + fVar12,
                      (fVar16 * fVar17 + fVar12) * -fVar13 + fVar17);
        fVar17 = V->x[1][2];
        fVar2 = V->x[0][2];
        fVar3 = V->x[0][3];
        fVar12 = V->x[2][2];
        fVar19 = V->x[3][2];
        fVar15 = V->x[1][3];
        fVar14 = V->x[2][3];
        fVar20 = V->x[3][3];
        V->x[0][2] = fVar2 - (fVar16 * fVar2 + fVar3) * fVar13;
        V->x[0][3] = (fVar2 - fVar16 * fVar3) * fVar13 + fVar3;
        *(ulong *)(V->x[1] + 2) =
             CONCAT44((fVar17 - fVar16 * fVar15) * fVar13 + fVar15,
                      fVar17 - (fVar16 * fVar17 + fVar15) * fVar13);
        *(ulong *)(V->x[2] + 2) =
             CONCAT44((fVar12 - fVar16 * fVar14) * fVar13 + fVar14,
                      fVar12 - (fVar16 * fVar12 + fVar14) * fVar13);
        *(ulong *)(V->x[3] + 2) =
             CONCAT44((fVar19 - fVar16 * fVar20) * fVar13 + fVar20,
                      fVar19 - (fVar16 * fVar19 + fVar20) * fVar13);
      }
      lVar7 = 0;
      pfVar9 = (float *)A;
      do {
        fVar17 = local_18[lVar7] + (&S->x)[lVar7];
        (&S->x)[lVar7] = fVar17;
        *pfVar9 = fVar17;
        lVar7 = lVar7 + 1;
        pfVar9 = pfVar9 + 5;
      } while (lVar7 != 4);
      fVar17 = 0.0;
      uVar8 = 0;
      pfVar9 = (float *)A;
      do {
        if (uVar8 < 3) {
          lVar7 = 1;
          fVar12 = fVar17;
          do {
            fVar17 = ABS(pfVar9[lVar7]);
            if (ABS(pfVar9[lVar7]) <= fVar12) {
              fVar17 = fVar12;
            }
            lVar1 = uVar8 + lVar7;
            lVar7 = lVar7 + 1;
            fVar12 = fVar17;
          } while (lVar1 != 3);
        }
        uVar8 = uVar8 + 1;
        pfVar9 = pfVar9 + 5;
      } while (uVar8 != 4);
    } while ((fVar11 < fVar17) && (bVar10 = uVar6 < 0x13, uVar6 = uVar6 + 1, bVar10));
  }
  return;
}

Assistant:

void
jacobiEigenSolver (Matrix44<T>& A, Vec4<T>& S, Matrix44<T>& V, const T tol)
{
    V.makeIdentity ();

    for (int i = 0; i < 4; ++i)
    {
        S[i] = A[i][i];
    }

    const int maxIter =
        20; // In case we get really unlucky, prevents infinite loops
    const T absTol =
        tol * maxOffDiagSymm (A); // Tolerance is in terms of the maximum
    if (absTol != 0)              // _off-diagonal_ entry.
    {
        int numIter = 0;
        do
        {
            ++numIter;
            Vec4<T> Z (0, 0, 0, 0);
            bool    changed = jacobiRotation<0, 1, 2, 3> (A, V, Z, tol);
            changed = jacobiRotation<0, 2, 1, 3> (A, V, Z, tol) || changed;
            changed = jacobiRotation<0, 3, 1, 2> (A, V, Z, tol) || changed;
            changed = jacobiRotation<1, 2, 0, 3> (A, V, Z, tol) || changed;
            changed = jacobiRotation<1, 3, 0, 2> (A, V, Z, tol) || changed;
            changed = jacobiRotation<2, 3, 0, 1> (A, V, Z, tol) || changed;
            for (int i = 0; i < 4; ++i)
            {
                A[i][i] = S[i] += Z[i];
            }
            if (!changed) break;
        } while (maxOffDiagSymm (A) > absTol && numIter < maxIter);
    }
}